

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O3

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoLayerSet::getGeometryShaderCode
          (GeometryShaderLayeredRenderingBoundaryConditionNoLayerSet *this)

{
  return 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\n#define MAX_VERTICES 4\n\nlayout(points)                                    in;\nlayout(triangle_strip, max_vertices=MAX_VERTICES) out;\n\nprecision highp float;\n\nflat out int layer_id;\n\nvoid main()\n{\n    layer_id    = 0;\n    gl_Position = vec4(1, 1, 0, 1);\n    EmitVertex();\n\n    layer_id    = 0;\n    gl_Position = vec4(1, -1, 0, 1);\n    EmitVertex();\n\n    layer_id    = 0;\n    gl_Position = vec4(-1, 1, 0, 1);\n    EmitVertex();\n\n    layer_id    = 0;\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n\n    EndPrimitive();\n}\n"
  ;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryConditionNoLayerSet::getGeometryShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"#define MAX_VERTICES 4\n"
								"\n"
								"layout(points)                                    in;\n"
								"layout(triangle_strip, max_vertices=MAX_VERTICES) out;\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat out int layer_id;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    layer_id    = 0;\n"
								"    gl_Position = vec4(1, 1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = 0;\n"
								"    gl_Position = vec4(1, -1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = 0;\n"
								"    gl_Position = vec4(-1, 1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = 0;\n"
								"    gl_Position = vec4(-1, -1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    EndPrimitive();\n"
								"}\n";
	return result;
}